

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepScanLine.cpp
# Opt level: O0

void anon_unknown.dwarf_89fa5::readCopyWriteTest(string *tempDir,int channelCount,int testTimes)

{
  ostream *poVar1;
  void *pvVar2;
  char *pcVar3;
  int in_EDX;
  int in_ESI;
  Compression compression;
  int compressionIndex;
  int i;
  string copy_filename;
  string source_filename;
  int in_stack_000004cc;
  string *in_stack_000004d0;
  Compression in_stack_00000618;
  int in_stack_0000061c;
  string *in_stack_00000620;
  int local_60;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1," channels ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  poVar1 = std::operator<<(poVar1," times.");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  for (local_60 = 0; local_60 < in_EDX; local_60 = local_60 + 1) {
    generateRandomFile(in_stack_00000620,in_stack_0000061c,in_stack_00000618);
    copyFile((string *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8);
    readFile(in_stack_000004d0,in_stack_000004cc);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
readCopyWriteTest (const std::string& tempDir, int channelCount, int testTimes)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;

    std::string source_filename =
        tempDir + "imf_test_copy_deep_scanline_source.exr";
    std::string copy_filename =
        tempDir + "imf_test_copy_deep_scanline_copy.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (source_filename, channelCount, compression);
        copyFile (source_filename, copy_filename);
        readFile (copy_filename, channelCount);
        remove (source_filename.c_str ());
        remove (copy_filename.c_str ());
        cout << endl << flush;
    }
}